

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O2

void __thiscall bdQueryHistory::printMsgs(bdQueryHistory *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "bdQueryHistory::printMsgs() IncomingQueries in last ");
  std::ostream::operator<<(poVar1,this->mStorePeriod);
  poVar1 = std::operator<<((ostream *)&std::cerr," secs");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->mHistory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->mHistory)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::operator<<((ostream *)&std::cerr,"\t");
    bdStdPrintId((ostream *)&std::cerr,(bdId *)(p_Var2 + 1));
    poVar1 = std::operator<<((ostream *)&std::cerr," ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    if (*(char *)&p_Var2[2]._M_parent == '\x01') {
      std::operator<<((ostream *)&std::cerr," BadPeer");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  return;
}

Assistant:

void bdQueryHistory::printMsgs() {
	std::ostream &out = std::cerr;

	out << "bdQueryHistory::printMsgs() IncomingQueries in last " << mStorePeriod;
	out << " secs" << std::endl;

	std::map<bdId, bdQueryHistoryList>::iterator it;
	for (it = mHistory.begin(); it != mHistory.end(); it++) {
		out << "\t";
		bdStdPrintId(out, &(it->first));
		out << " " << it->second.mList.size();
		if (it->second.mBadPeer)
			out << " BadPeer";
		out << std::endl;
	}
}